

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hook.c
# Opt level: O3

void * duckdb_je_hook_install(tsdn_t *tsdn,hooks_t *to_install)

{
  ulong uVar1;
  size_t sVar2;
  int iVar3;
  atomic_zu_t *paVar4;
  size_t i_1;
  long lVar5;
  ulong uVar6;
  size_t i;
  long lVar7;
  seq_hooks_t *psVar8;
  size_t buf [5];
  undefined4 local_50;
  hook_alloc local_48;
  hook_dalloc p_Stack_40;
  hook_expand local_38;
  void *pvStack_30;
  byte local_28;
  undefined4 local_27;
  
  uVar6 = 0;
  iVar3 = pthread_mutex_trylock((pthread_mutex_t *)((long)&hooks_mu.field_0 + 0x48));
  if (iVar3 != 0) {
    uVar6 = 0;
    duckdb_je_malloc_mutex_lock_slow(&hooks_mu);
    hooks_mu.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  hooks_mu.field_0.field_0.prof_data.n_lock_ops = hooks_mu.field_0.field_0.prof_data.n_lock_ops + 1;
  if (hooks_mu.field_0.field_0.prof_data.prev_owner != tsdn) {
    hooks_mu.field_0.witness.link.qre_prev =
         (witness_t *)(hooks_mu.field_0.field_0.prof_data.n_owner_switches + 1);
    hooks_mu.field_0.field_0.prof_data.prev_owner = tsdn;
  }
  paVar4 = hooks[0].data;
  lVar5 = 0;
  while( true ) {
    psVar8 = hooks + lVar5;
    uVar1 = hooks[lVar5].seq.repr;
    if ((uVar1 & 1) == 0) {
      lVar7 = 0;
      do {
        (&local_48)[lVar7] = (hook_alloc)paVar4[lVar7].repr;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 5);
      if (uVar1 == (psVar8->seq).repr) {
        uVar6 = (ulong)local_28;
        local_50 = local_27;
      }
    }
    if ((uVar6 & 1) == 0) break;
    lVar5 = lVar5 + 1;
    paVar4 = paVar4 + 6;
    if (lVar5 == 4) {
      psVar8 = (seq_hooks_t *)0x0;
LAB_01c51277:
      hooks_mu.field_0.field_0.locked.repr = (atomic_b_t)false;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&hooks_mu.field_0 + 0x48));
      return psVar8;
    }
  }
  local_38 = to_install->expand_hook;
  pvStack_30 = to_install->extra;
  local_48 = to_install->alloc_hook;
  p_Stack_40 = to_install->dalloc_hook;
  local_28 = 1;
  local_27 = local_50;
  sVar2 = (psVar8->seq).repr;
  (psVar8->seq).repr = sVar2 + 1;
  lVar5 = 0;
  do {
    paVar4->repr = (size_t)(&local_48)[lVar5];
    lVar5 = lVar5 + 1;
    paVar4 = paVar4 + 1;
  } while (lVar5 != 5);
  (psVar8->seq).repr = sVar2 + 2;
  nhooks.repr = nhooks.repr + 1;
  duckdb_je_tsd_global_slow_inc(tsdn);
  goto LAB_01c51277;
}

Assistant:

void *
hook_install(tsdn_t *tsdn, hooks_t *to_install) {
	malloc_mutex_lock(tsdn, &hooks_mu);
	void *ret = hook_install_locked(to_install);
	if (ret != NULL) {
		tsd_global_slow_inc(tsdn);
	}
	malloc_mutex_unlock(tsdn, &hooks_mu);
	return ret;
}